

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
slang::parseList(string_view value,bool allowCommaList,
                SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *splitMem)

{
  size_type sVar1;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_RCX;
  byte in_DL;
  size_type index;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffffa0
  ;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffa8;
  char *__n;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffb8;
  undefined1 local_10 [16];
  
  if ((in_DL & 1) != 0) {
    while( true ) {
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,0xea6d3b);
      __n = in_stack_ffffffffffffffa8._M_str;
      if (sVar1 == 0xffffffffffffffff) break;
      in_stack_ffffffffffffffa0 = in_RCX;
      in_stack_ffffffffffffffb8 =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      in_stack_ffffffffffffffb8._M_str,in_stack_ffffffffffffffb8._M_len,
                      (size_type)__n);
      SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::push_back
                (in_stack_ffffffffffffffa0,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_stack_ffffffffffffffa8 =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      in_stack_ffffffffffffffb8._M_str,in_stack_ffffffffffffffb8._M_len,
                      (size_type)__n);
    }
  }
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::push_back
            (in_stack_ffffffffffffffa0,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
  span<slang::SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>_&>
            ((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
              *)in_stack_ffffffffffffffa8._M_str,
             (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
             in_stack_ffffffffffffffa8._M_len);
  return (span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>)
         local_10;
}

Assistant:

static std::span<const std::string_view> parseList(std::string_view value, bool allowCommaList,
                                                   SmallVector<std::string_view>& splitMem) {
    if (allowCommaList) {
        while (true) {
            auto index = value.find_first_of(',');
            if (index == std::string_view::npos)
                break;

            splitMem.push_back(value.substr(0, index));
            value = value.substr(index + 1);
        }
    }
    splitMem.push_back(value);
    return splitMem;
}